

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::call_abort(session_impl *this)

{
  io_context *ctx;
  shared_ptr<libtorrent::aux::session_impl> ptr;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> _Stack_78;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> local_68;
  allocating_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__session_impl_hpp:352:41),_72UL,_(libtorrent::aux::HandlerName)4>
  local_58;
  undefined8 local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  ::std::__shared_ptr<libtorrent::aux::session_impl,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::session_impl,void>
            ((__shared_ptr<libtorrent::aux::session_impl,(__gnu_cxx::_Lock_policy)2> *)&_Stack_78,
             (__weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::aux::session_impl>);
  ctx = this->m_io_context;
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,&_Stack_78);
  local_58.handler.ptr.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_68._M_refcount._M_pi;
  local_58.handler.ptr.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_68._M_ptr;
  local_58.storage = &this->m_abort_handler_storage;
  local_58.error_handler = &this->super_error_handler_interface;
  local_68._M_ptr = (element_type *)0x0;
  local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_30 = 0;
  _Stack_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28);
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::aux::allocating_handler<libtorrent::aux::session_impl::call_abort()::_lambda()_1_,72ul,(libtorrent::aux::HandlerName)4>>
            (ctx,&local_58,(type *)0x0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.handler.ptr.
              super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_78._M_refcount);
  return;
}

Assistant:

void call_abort()
			{
				auto ptr = shared_from_this();
				dispatch(m_io_context, make_handler([ptr] { ptr->abort(); }
					, m_abort_handler_storage, *this));
			}